

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O3

void __thiscall cmLBDepend::DependWalk(cmLBDepend *this,cmDependInformation *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  cmLBDepend *pcVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  pointer pbVar10;
  char cVar11;
  string path;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string cxxFile;
  string includeFile;
  string root;
  ifstream fin;
  string local_310;
  cmLBDepend *local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  cmDependInformation *local_268;
  long *local_260;
  long local_258;
  long local_250 [2];
  RegularExpression *local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(info->FullPath)._M_dataplus._M_p,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    local_2e8._M_string_length = 0;
    local_2e8.field_2._M_local_buf[0] = '\0';
    local_240 = &this->IncludeFileRegularExpression;
    paVar1 = &local_2c8.field_2;
    local_2f0 = this;
    local_268 = info;
    while (bVar5 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)local_238,&local_2e8,(bool *)0x0,-1), bVar5) {
      iVar8 = strncmp(local_2e8._M_dataplus._M_p,"#include",8);
      if (iVar8 == 0) {
        cVar11 = (char)&local_2e8;
        lVar9 = std::__cxx11::string::find(cVar11,0x22);
        if (lVar9 == -1) {
          lVar9 = std::__cxx11::string::find(cVar11,0x3c);
          if (lVar9 != -1) {
            bVar6 = 0x3e;
            goto LAB_001d9173;
          }
          std::operator+(&local_288,"unknown include directive ",&local_2e8);
          cmSystemTools::Error(&local_288);
        }
        else {
          bVar6 = 0x22;
LAB_001d9173:
          std::__cxx11::string::find((char)&local_2e8,(ulong)bVar6);
          std::__cxx11::string::substr((ulong)&local_288,(ulong)&local_2e8);
          bVar5 = cmsys::RegularExpression::find
                            (local_240,local_288._M_dataplus._M_p,&local_240->regmatch);
          if (bVar5) {
            AddDependency(local_2f0,local_268,local_288._M_dataplus._M_p);
            local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2a8,local_288._M_dataplus._M_p,
                       local_288._M_dataplus._M_p + local_288._M_string_length);
            lVar9 = std::__cxx11::string::rfind((char)&local_2a8,0x2e);
            if (lVar9 != -1) {
              std::__cxx11::string::substr((ulong)&local_260,(ulong)&local_2a8);
              local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_310,local_260,local_258 + (long)local_260);
              std::__cxx11::string::append((char *)&local_310);
              std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_310);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_310._M_dataplus._M_p != &local_310.field_2) {
                operator_delete(local_310._M_dataplus._M_p,
                                local_310.field_2._M_allocated_capacity + 1);
              }
              bVar5 = cmsys::SystemTools::FileExists(&local_2a8);
              pbVar2 = (local_2f0->IncludeDirectories).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pbVar10 = (local_2f0->IncludeDirectories).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar2;
                  pbVar10 = pbVar10 + 1) {
                local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
                pcVar3 = (pbVar10->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_310,pcVar3,pcVar3 + pbVar10->_M_string_length);
                local_2c8._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_2c8,local_310._M_dataplus._M_p,
                           local_310._M_dataplus._M_p + local_310._M_string_length);
                std::__cxx11::string::append((char *)&local_2c8);
                std::__cxx11::string::operator=((string *)&local_310,(string *)&local_2c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c8._M_dataplus._M_p != paVar1) {
                  operator_delete(local_2c8._M_dataplus._M_p,
                                  local_2c8.field_2._M_allocated_capacity + 1);
                }
                std::operator+(&local_2c8,&local_310,&local_2a8);
                std::__cxx11::string::operator=((string *)&local_310,(string *)&local_2c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c8._M_dataplus._M_p != paVar1) {
                  operator_delete(local_2c8._M_dataplus._M_p,
                                  local_2c8.field_2._M_allocated_capacity + 1);
                }
                bVar7 = cmsys::SystemTools::FileExists(&local_310);
                if (bVar7) {
                  bVar5 = true;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_310._M_dataplus._M_p != &local_310.field_2) {
                  operator_delete(local_310._M_dataplus._M_p,
                                  local_310.field_2._M_allocated_capacity + 1);
                }
              }
              if (bVar5 == false) {
                local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_310,local_260,local_258 + (long)local_260);
                std::__cxx11::string::append((char *)&local_310);
                pcVar4 = local_2f0;
                std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_310);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_310._M_dataplus._M_p != &local_310.field_2) {
                  operator_delete(local_310._M_dataplus._M_p,
                                  local_310.field_2._M_allocated_capacity + 1);
                }
                bVar7 = cmsys::SystemTools::FileExists(&local_2a8);
                if (bVar7) {
                  bVar5 = true;
                }
                pbVar2 = (pcVar4->IncludeDirectories).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                for (pbVar10 = (pcVar4->IncludeDirectories).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar2;
                    pbVar10 = pbVar10 + 1) {
                  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
                  pcVar3 = (pbVar10->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_310,pcVar3,pcVar3 + pbVar10->_M_string_length);
                  local_2c8._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_2c8,local_310._M_dataplus._M_p,
                             local_310._M_dataplus._M_p + local_310._M_string_length);
                  std::__cxx11::string::append((char *)&local_2c8);
                  std::__cxx11::string::operator=((string *)&local_310,(string *)&local_2c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2c8._M_dataplus._M_p != paVar1) {
                    operator_delete(local_2c8._M_dataplus._M_p,
                                    local_2c8.field_2._M_allocated_capacity + 1);
                  }
                  std::operator+(&local_2c8,&local_310,&local_2a8);
                  std::__cxx11::string::operator=((string *)&local_310,(string *)&local_2c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2c8._M_dataplus._M_p != paVar1) {
                    operator_delete(local_2c8._M_dataplus._M_p,
                                    local_2c8.field_2._M_allocated_capacity + 1);
                  }
                  bVar7 = cmsys::SystemTools::FileExists(&local_310);
                  if (bVar7) {
                    bVar5 = true;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_310._M_dataplus._M_p != &local_310.field_2) {
                    operator_delete(local_310._M_dataplus._M_p,
                                    local_310.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              if (bVar5 == false) {
                local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_310,local_260,local_258 + (long)local_260);
                std::__cxx11::string::append((char *)&local_310);
                pcVar4 = local_2f0;
                std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_310);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_310._M_dataplus._M_p != &local_310.field_2) {
                  operator_delete(local_310._M_dataplus._M_p,
                                  local_310.field_2._M_allocated_capacity + 1);
                }
                bVar7 = cmsys::SystemTools::FileExists(&local_2a8);
                if (bVar7) {
                  bVar5 = true;
                }
                pbVar2 = (pcVar4->IncludeDirectories).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                for (pbVar10 = (pcVar4->IncludeDirectories).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar2;
                    pbVar10 = pbVar10 + 1) {
                  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
                  pcVar3 = (pbVar10->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_310,pcVar3,pcVar3 + pbVar10->_M_string_length);
                  local_2c8._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_2c8,local_310._M_dataplus._M_p,
                             local_310._M_dataplus._M_p + local_310._M_string_length);
                  std::__cxx11::string::append((char *)&local_2c8);
                  std::__cxx11::string::operator=((string *)&local_310,(string *)&local_2c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2c8._M_dataplus._M_p != paVar1) {
                    operator_delete(local_2c8._M_dataplus._M_p,
                                    local_2c8.field_2._M_allocated_capacity + 1);
                  }
                  std::operator+(&local_2c8,&local_310,&local_2a8);
                  std::__cxx11::string::operator=((string *)&local_310,(string *)&local_2c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2c8._M_dataplus._M_p != paVar1) {
                    operator_delete(local_2c8._M_dataplus._M_p,
                                    local_2c8.field_2._M_allocated_capacity + 1);
                  }
                  bVar7 = cmsys::SystemTools::FileExists(&local_310);
                  if (bVar7) {
                    bVar5 = true;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_310._M_dataplus._M_p != &local_310.field_2) {
                    operator_delete(local_310._M_dataplus._M_p,
                                    local_310.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              if (bVar5 == false) {
                local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_310,local_260,local_258 + (long)local_260);
                std::__cxx11::string::append((char *)&local_310);
                pcVar4 = local_2f0;
                std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_310);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_310._M_dataplus._M_p != &local_310.field_2) {
                  operator_delete(local_310._M_dataplus._M_p,
                                  local_310.field_2._M_allocated_capacity + 1);
                }
                bVar7 = cmsys::SystemTools::FileExists(&local_2a8);
                if (bVar7) {
                  bVar5 = true;
                }
                pbVar2 = (pcVar4->IncludeDirectories).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                for (pbVar10 = (pcVar4->IncludeDirectories).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar2;
                    pbVar10 = pbVar10 + 1) {
                  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
                  pcVar3 = (pbVar10->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_310,pcVar3,pcVar3 + pbVar10->_M_string_length);
                  local_2c8._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_2c8,local_310._M_dataplus._M_p,
                             local_310._M_dataplus._M_p + local_310._M_string_length);
                  std::__cxx11::string::append((char *)&local_2c8);
                  std::__cxx11::string::operator=((string *)&local_310,(string *)&local_2c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2c8._M_dataplus._M_p != paVar1) {
                    operator_delete(local_2c8._M_dataplus._M_p,
                                    local_2c8.field_2._M_allocated_capacity + 1);
                  }
                  std::operator+(&local_2c8,&local_310,&local_2a8);
                  std::__cxx11::string::operator=((string *)&local_310,(string *)&local_2c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2c8._M_dataplus._M_p != paVar1) {
                    operator_delete(local_2c8._M_dataplus._M_p,
                                    local_2c8.field_2._M_allocated_capacity + 1);
                  }
                  bVar7 = cmsys::SystemTools::FileExists(&local_310);
                  if (bVar7) {
                    bVar5 = true;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_310._M_dataplus._M_p != &local_310.field_2) {
                    operator_delete(local_310._M_dataplus._M_p,
                                    local_310.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              if (bVar5 != false) {
                AddDependency(local_2f0,local_268,local_2a8._M_dataplus._M_p);
              }
              if (local_260 != local_250) {
                operator_delete(local_260,local_250[0] + 1);
              }
            }
          }
          else {
            if (local_2f0->Verbose != true) goto LAB_001d94d2;
            local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"Skipping ","");
            std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_288._M_dataplus._M_p);
            std::__cxx11::string::append((char *)&local_2a8);
            std::__cxx11::string::_M_append
                      ((char *)&local_2a8,(ulong)(local_268->FullPath)._M_dataplus._M_p);
            cmSystemTools::Error(&local_2a8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
        }
LAB_001d94d2:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  else {
    std::operator+(&local_2e8,"error can not open ",&info->FullPath);
    cmSystemTools::Error(&local_2e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,
                    CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                             local_2e8.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void DependWalk(cmDependInformation* info)
  {
    cmsys::ifstream fin(info->FullPath.c_str());
    if (!fin) {
      cmSystemTools::Error("error can not open " + info->FullPath);
      return;
    }

    std::string line;
    while (cmSystemTools::GetLineFromStream(fin, line)) {
      if (cmHasLiteralPrefix(line, "#include")) {
        // if it is an include line then create a string class
        size_t qstart = line.find('\"', 8);
        size_t qend;
        // if a quote is not found look for a <
        if (qstart == std::string::npos) {
          qstart = line.find('<', 8);
          // if a < is not found then move on
          if (qstart == std::string::npos) {
            cmSystemTools::Error("unknown include directive " + line);
            continue;
          }
          qend = line.find('>', qstart + 1);
        } else {
          qend = line.find('\"', qstart + 1);
        }
        // extract the file being included
        std::string includeFile = line.substr(qstart + 1, qend - qstart - 1);
        // see if the include matches the regular expression
        if (!this->IncludeFileRegularExpression.find(includeFile)) {
          if (this->Verbose) {
            std::string message = "Skipping ";
            message += includeFile;
            message += " for file ";
            message += info->FullPath;
            cmSystemTools::Error(message);
          }
          continue;
        }

        // Add this file and all its dependencies.
        this->AddDependency(info, includeFile.c_str());
        /// add the cxx file if it exists
        std::string cxxFile = includeFile;
        std::string::size_type pos = cxxFile.rfind('.');
        if (pos != std::string::npos) {
          std::string root = cxxFile.substr(0, pos);
          cxxFile = root + ".cxx";
          bool found = false;
          // try jumping to .cxx .cpp and .c in order
          if (cmSystemTools::FileExists(cxxFile)) {
            found = true;
          }
          for (std::string path : this->IncludeDirectories) {
            path = path + "/";
            path = path + cxxFile;
            if (cmSystemTools::FileExists(path)) {
              found = true;
            }
          }
          if (!found) {
            cxxFile = root + ".cpp";
            if (cmSystemTools::FileExists(cxxFile)) {
              found = true;
            }
            for (std::string path : this->IncludeDirectories) {
              path = path + "/";
              path = path + cxxFile;
              if (cmSystemTools::FileExists(path)) {
                found = true;
              }
            }
          }
          if (!found) {
            cxxFile = root + ".c";
            if (cmSystemTools::FileExists(cxxFile)) {
              found = true;
            }
            for (std::string path : this->IncludeDirectories) {
              path = path + "/";
              path = path + cxxFile;
              if (cmSystemTools::FileExists(path)) {
                found = true;
              }
            }
          }
          if (!found) {
            cxxFile = root + ".txx";
            if (cmSystemTools::FileExists(cxxFile)) {
              found = true;
            }
            for (std::string path : this->IncludeDirectories) {
              path = path + "/";
              path = path + cxxFile;
              if (cmSystemTools::FileExists(path)) {
                found = true;
              }
            }
          }
          if (found) {
            this->AddDependency(info, cxxFile.c_str());
          }
        }
      }
    }
  }